

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

event_config * event_config_new(void)

{
  event_config *cfg;
  
  cfg = (event_config *)event_mm_calloc_(1,0x38);
  if (cfg == (event_config *)0x0) {
    cfg = (event_config *)0x0;
  }
  else {
    (cfg->entries).tqh_first = (event_config_entry *)0x0;
    (cfg->entries).tqh_last = (event_config_entry **)cfg;
    (cfg->max_dispatch_interval).tv_sec = -1;
    cfg->max_dispatch_callbacks = 0x7fffffff;
    cfg->limit_callbacks_after_prio = 1;
  }
  return cfg;
}

Assistant:

struct event_config *
event_config_new(void)
{
	struct event_config *cfg = mm_calloc(1, sizeof(*cfg));

	if (cfg == NULL)
		return (NULL);

	TAILQ_INIT(&cfg->entries);
	cfg->max_dispatch_interval.tv_sec = -1;
	cfg->max_dispatch_callbacks = INT_MAX;
	cfg->limit_callbacks_after_prio = 1;

	return (cfg);
}